

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O0

XMLSize_t __thiscall xercesc_4_0::WFElemStack::addLevel(WFElemStack *this)

{
  StackElem *this_00;
  WFElemStack *this_local;
  
  if (this->fStackTop == this->fStackCapacity) {
    expandStack(this);
  }
  if (this->fStack[this->fStackTop] == (StackElem *)0x0) {
    this_00 = (StackElem *)XMemory::operator_new(0x18,this->fMemoryManager);
    StackElem::StackElem(this_00);
    this->fStack[this->fStackTop] = this_00;
    this->fStack[this->fStackTop]->fThisElement = (XMLCh *)0x0;
    this->fStack[this->fStackTop]->fElemMaxLength = 0;
  }
  this->fStack[this->fStackTop]->fReaderNum = 0xffffffff;
  this->fStack[this->fStackTop]->fCurrentURI = this->fUnknownNamespaceId;
  this->fStack[this->fStackTop]->fTopPrefix = -1;
  if (this->fStackTop != 0) {
    this->fStack[this->fStackTop]->fTopPrefix = this->fStack[this->fStackTop - 1]->fTopPrefix;
  }
  this->fStackTop = this->fStackTop + 1;
  return this->fStackTop - 1;
}

Assistant:

XMLSize_t WFElemStack::addLevel()
{
    // See if we need to expand the stack
    if (fStackTop == fStackCapacity)
        expandStack();

    
    // If this element has not been initialized yet, then initialize it
    if (!fStack[fStackTop])
    {
        fStack[fStackTop] = new (fMemoryManager) StackElem;
        fStack[fStackTop]->fThisElement = 0;
        fStack[fStackTop]->fElemMaxLength = 0;
    }

    // Set up the new top row
    fStack[fStackTop]->fReaderNum = 0xFFFFFFFF;
    fStack[fStackTop]->fCurrentURI = fUnknownNamespaceId;
    fStack[fStackTop]->fTopPrefix = -1;

    if (fStackTop != 0)
        fStack[fStackTop]->fTopPrefix = fStack[fStackTop - 1]->fTopPrefix;

    // Bump the top of stack
    fStackTop++;

    return fStackTop-1;
}